

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall covenant::CFG::get_alphabet_min_and_max(CFG *this,int *min,int *max)

{
  long lVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  pointer pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int local_7c;
  vector<int,_std::allocator<int>_> terminals;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  
  terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar3 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    lVar1 = (long)(this->prods).
                  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
    if ((ulong)(lVar1 / 0x18) <= uVar5) break;
    uVar6 = 0;
    while( true ) {
      lVar1 = *(long *)&pvVar3[uVar5].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar3[uVar5].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar6
         ) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 &RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>,
                 (this->rules).
                 super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar1 + (ulong)uVar6 * 4));
      if (((long)RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start == 4) &&
         (((RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start)->x & 1U) == 0)) {
        local_7c = (RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                    super__Vector_impl_data._M_start)->x >> 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&terminals,&local_7c);
      }
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base
                (&RHS.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>);
      uVar6 = uVar6 + 1;
      pvVar3 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar4 = uVar4 + 1;
  }
  _Var2 = std::
          __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,lVar1 % 0x18);
  *min = *_Var2._M_current;
  _Var2 = std::
          __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     terminals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  *max = *_Var2._M_current;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&terminals.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void get_alphabet_min_and_max(int &min, int &max)
    {
      vector<int> terminals;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 1 && RHS[0].isTerm())
            terminals.push_back(RHS[0].symID());
        }
      }
      min = *min_element(terminals.begin(), terminals.end());
      max = *max_element(terminals.begin(), terminals.end());
    }